

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

GLFWvidmode * glfwGetVideoMode(GLFWmonitor *handle)

{
  GLFWbool GVar1;
  GLFWvidmode *pGVar2;
  
  if (handle == (GLFWmonitor *)0x0) {
    __assert_fail("monitor != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/monitor.c"
                  ,0x1c1,"const GLFWvidmode *glfwGetVideoMode(GLFWmonitor *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    pGVar2 = (GLFWvidmode *)0x0;
  }
  else {
    GVar1 = (*_glfw.platform.getVideoMode)((_GLFWmonitor *)handle,(GLFWvidmode *)(handle + 0xa4));
    pGVar2 = (GLFWvidmode *)0x0;
    if (GVar1 != 0) {
      pGVar2 = (GLFWvidmode *)(handle + 0xa4);
    }
  }
  return pGVar2;
}

Assistant:

GLFWAPI const GLFWvidmode* glfwGetVideoMode(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    assert(monitor != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfw.platform.getVideoMode(monitor, &monitor->currentMode))
        return NULL;

    return &monitor->currentMode;
}